

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

size_t CalculateBlockSymbolSizeGivenCounts
                 (size_t *ll_counts,size_t *d_counts,uint *ll_lengths,uint *d_lengths,
                 ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  size_t in_RCX;
  ZopfliLZ77Store *in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  size_t in_R8;
  long in_R9;
  size_t i;
  size_t result;
  ulong local_48;
  long local_40;
  size_t local_8;
  
  local_40 = 0;
  if (result < in_R9 + 0x360U) {
    local_8 = CalculateBlockSymbolSizeSmall(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  }
  else {
    for (local_48 = 0; local_48 < 0x100; local_48 = local_48 + 1) {
      local_40 = (ulong)*(uint *)((long)&in_RDX->litlens + local_48 * 4) *
                 *(long *)(in_RDI + local_48 * 2) + local_40;
    }
    for (local_48 = 0x101; local_48 < 0x11e; local_48 = local_48 + 1) {
      uVar1 = *(uint *)((long)&in_RDX->litlens + local_48 * 4);
      lVar2 = *(long *)(in_RDI + local_48 * 2);
      iVar3 = ZopfliGetLengthSymbolExtraBits((int)local_48);
      local_40 = (long)iVar3 * *(long *)(in_RDI + local_48 * 2) + (ulong)uVar1 * lVar2 + local_40;
    }
    for (local_48 = 0; local_48 < 0x1e; local_48 = local_48 + 1) {
      uVar1 = *(uint *)(in_RCX + local_48 * 4);
      lVar2 = *(long *)(in_RSI + local_48 * 2);
      iVar3 = ZopfliGetDistSymbolExtraBits((int)local_48);
      local_40 = (long)iVar3 * *(long *)(in_RSI + local_48 * 2) + (ulong)uVar1 * lVar2 + local_40;
    }
    local_8 = (ulong)(uint)in_RDX[0xe].size + local_40;
  }
  return local_8;
}

Assistant:

static size_t CalculateBlockSymbolSizeGivenCounts(const size_t* ll_counts,
                                                  const size_t* d_counts,
                                                  const unsigned* ll_lengths,
                                                  const unsigned* d_lengths,
                                                  const ZopfliLZ77Store* lz77,
                                                  size_t lstart, size_t lend) {
  size_t result = 0;
  size_t i;
  if (lstart + ZOPFLI_NUM_LL * 3 > lend) {
    return CalculateBlockSymbolSizeSmall(
        ll_lengths, d_lengths, lz77, lstart, lend);
  } else {
    for (i = 0; i < 256; i++) {
      result += ll_lengths[i] * ll_counts[i];
    }
    for (i = 257; i < 286; i++) {
      result += ll_lengths[i] * ll_counts[i];
      result += ZopfliGetLengthSymbolExtraBits(i) * ll_counts[i];
    }
    for (i = 0; i < 30; i++) {
      result += d_lengths[i] * d_counts[i];
      result += ZopfliGetDistSymbolExtraBits(i) * d_counts[i];
    }
    result += ll_lengths[256]; /*end symbol*/
    return result;
  }
}